

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

void __thiscall cppgenerate::Class::print(Class *this,ostream *output,bool headerOnly)

{
  pointer pcVar1;
  pointer pPVar2;
  ostream *poVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  CodeBlock *pCVar6;
  ostringstream *poVar7;
  bool bVar8;
  long lVar9;
  char *pcVar10;
  _Rb_tree_header *p_Var11;
  pointer pPVar12;
  string include;
  string classNameUpper;
  CodeBlock block;
  char *local_2f8;
  long local_2f0;
  char local_2e8 [16];
  AccessModifier local_2d8;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [384];
  
  CodeBlock::CodeBlock((CodeBlock *)local_1b0);
  pcVar1 = (this->m_className)._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (this->m_className)._M_string_length);
  uppercase(&local_2b0,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"#ifndef ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_H",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"#define ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_H",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  p_Var5 = (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var11) {
    do {
      local_2f8 = local_2e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(output,"#include <",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,local_2f8,local_2f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2f8 != local_2e8) {
        operator_delete(local_2f8);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var11);
  }
  p_Var5 = (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var11) {
    do {
      local_2f8 = local_2e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(output,"#include \"",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(output,local_2f8,local_2f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2f8 != local_2e8) {
        operator_delete(local_2f8);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var11);
  }
  if (1 < (this->m_namespace)._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"namespace ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,(this->m_namespace)._M_dataplus._M_p,
                        (this->m_namespace)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((this->m_documentation)._M_string_length != 0) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/*","");
    pCVar6 = CodeBlock::addLine((CodeBlock *)local_1b0,&local_210);
    pcVar1 = (this->m_documentation)._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar1,pcVar1 + (this->m_documentation)._M_string_length);
    pCVar6 = CodeBlock::addLine(pCVar6,&local_230);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"*/","");
    CodeBlock::addLine(pCVar6,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  std::operator+(&local_1d0,"class ",&this->m_className);
  CodeBlock::addLine((CodeBlock *)local_1b0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((this->m_parents).
      super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_parents).
      super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," : ",3);
    pPVar12 = (this->m_parents).
              super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (this->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar12 != pPVar2) {
      bVar8 = false;
      do {
        pcVar1 = (pPVar12->parentName)._M_dataplus._M_p;
        local_2f8 = local_2e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar1,pcVar1 + (pPVar12->parentName)._M_string_length);
        local_2d8 = pPVar12->inheritanceType;
        pcVar1 = (pPVar12->initializer)._M_dataplus._M_p;
        local_2d0[0] = local_2c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d0,pcVar1,pcVar1 + (pPVar12->initializer)._M_string_length);
        if (bVar8) {
          poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,", ",2);
        }
        if (local_2d8 == PROTECTED) {
          poVar3 = (ostream *)CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
          lVar9 = 10;
          pcVar10 = "protected ";
LAB_0010d1fb:
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar10,lVar9);
        }
        else if (local_2d8 == PUBLIC) {
          poVar3 = (ostream *)CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
          lVar9 = 7;
          pcVar10 = "public ";
          goto LAB_0010d1fb;
        }
        poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar7,local_2f8,local_2f0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        if (local_2d0[0] != local_2c0) {
          operator_delete(local_2d0[0]);
        }
        if (local_2f8 != local_2e8) {
          operator_delete(local_2f8);
        }
        pPVar12 = pPVar12 + 1;
        bVar8 = true;
      } while (pPVar12 != pPVar2);
    }
  }
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (this->m_isQobject == true) {
    pCVar6 = CodeBlock::indent((CodeBlock *)local_1b0);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Q_OBJECT","");
    pCVar6 = CodeBlock::addLine(pCVar6,&local_270);
    CodeBlock::unindent(pCVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
  }
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  bVar8 = !headerOnly;
  printConstructors(this,(ostream *)poVar7,PUBLIC,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printConstructors(this,(ostream *)poVar7,PROTECTED,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printConstructors(this,(ostream *)poVar7,PRIVATE,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printMethods(this,(ostream *)poVar7,PUBLIC,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printMethods(this,(ostream *)poVar7,PROTECTED,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printMethods(this,(ostream *)poVar7,PRIVATE,bVar8);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printVariables(this,(ostream *)poVar7,PUBLIC);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printVariables(this,(ostream *)poVar7,PROTECTED);
  poVar7 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1b0);
  printVariables(this,(ostream *)poVar7,PRIVATE);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"};","");
  CodeBlock::addLine((CodeBlock *)local_1b0,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  CodeBlock::print((CodeBlock *)local_1b0,output);
  if (1 < (this->m_namespace)._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"} /* namespace ",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,(this->m_namespace)._M_dataplus._M_p,
                        (this->m_namespace)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," */",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"#endif /* ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_H */",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  return;
}

Assistant:

void Class::print( std::ostream& output, bool headerOnly ) const {
    cppgenerate::CodeBlock block;
    std::string classNameUpper = cppgenerate::uppercase( m_className );

    output << "#ifndef " << classNameUpper << "_H" << std::endl;
    output << "#define " << classNameUpper << "_H" << std::endl << std::endl;

    for( std::string include : m_systemIncludes ){
        output << "#include <" << include << ">" << std::endl;
    }

    for( std::string include : m_localIncludes ){
        output << "#include \"" << include << "\"" << std::endl;
    }

    if( m_namespace.size() > 1 ){
        output << "namespace " << m_namespace << " {" << std::endl;
    }

    if( m_documentation.size() > 0 ){
        block.addLine( "/*" )
            .addLine( m_documentation )
            .addLine( "*/" );
    }
    block.addLine( "class " + m_className );

    if( m_parents.size() > 0 ){
        bool comma = false;
        block.buffer() << " : ";
        for( Parent parent : m_parents ){
            if( comma ) block.buffer() << ", ";
            switch( parent.inheritanceType ){
            case cppgenerate::AccessModifier::PUBLIC:
                block.buffer() << "public ";
                break;
            case cppgenerate::AccessModifier::PROTECTED:
                block.buffer() << "protected ";
                break;
            default:
                break;
            }
            block.buffer() << parent.parentName << " ";
            comma = true;
        }
    }

    block.buffer() << "{" << std::endl;

    if( m_isQobject ){
        block.indent()
            .addLine( "Q_OBJECT" )
            .unindent();
    }


    printConstructors( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printMethods( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printVariables( block.buffer(), AccessModifier::PUBLIC );
    printVariables( block.buffer(), AccessModifier::PROTECTED );
    printVariables( block.buffer(), AccessModifier::PRIVATE );


    block.addLine( "};" );

    block.print( output );

    if( m_namespace.size() > 1 ){
        output << "} /* namespace " << m_namespace << " */" << std::endl;
    }

    output << "#endif /* " << classNameUpper << "_H */" << std::endl;
}